

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileLockPool.cxx
# Opt level: O1

cmFileLockResult __thiscall cmFileLockPool::Release(cmFileLockPool *this,string *filename)

{
  pointer ppSVar1;
  bool bVar2;
  cmFileLockResult in_RAX;
  cmFileLockResult cVar3;
  pointer ppSVar4;
  List *__range1;
  bool bVar5;
  cmFileLockResult local_38;
  
  ppSVar4 = (this->FunctionScopes).
            super__Vector_base<cmFileLockPool::ScopePool_*,_std::allocator<cmFileLockPool::ScopePool_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppSVar1 = (this->FunctionScopes).
            super__Vector_base<cmFileLockPool::ScopePool_*,_std::allocator<cmFileLockPool::ScopePool_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  bVar5 = ppSVar4 == ppSVar1;
  local_38 = in_RAX;
  if (!bVar5) {
    local_38 = ScopePool::Release(*ppSVar4,filename);
    bVar2 = cmFileLockResult::IsOk(&local_38);
    if (bVar2) {
      do {
        ppSVar4 = ppSVar4 + 1;
        bVar5 = ppSVar4 == ppSVar1;
        if (bVar5) goto LAB_00393e73;
        local_38 = ScopePool::Release(*ppSVar4,filename);
        bVar2 = cmFileLockResult::IsOk(&local_38);
      } while (bVar2);
    }
    if (!bVar5) {
      return local_38;
    }
  }
LAB_00393e73:
  ppSVar4 = (this->FileScopes).
            super__Vector_base<cmFileLockPool::ScopePool_*,_std::allocator<cmFileLockPool::ScopePool_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppSVar1 = (this->FileScopes).
            super__Vector_base<cmFileLockPool::ScopePool_*,_std::allocator<cmFileLockPool::ScopePool_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  bVar5 = ppSVar4 == ppSVar1;
  if (!bVar5) {
    local_38 = ScopePool::Release(*ppSVar4,filename);
    bVar2 = cmFileLockResult::IsOk(&local_38);
    if (bVar2) {
      do {
        ppSVar4 = ppSVar4 + 1;
        bVar5 = ppSVar4 == ppSVar1;
        if (bVar5) goto LAB_00393ed4;
        local_38 = ScopePool::Release(*ppSVar4,filename);
        bVar2 = cmFileLockResult::IsOk(&local_38);
      } while (bVar2);
    }
    if (!bVar5) {
      return local_38;
    }
  }
LAB_00393ed4:
  cVar3 = ScopePool::Release(&this->ProcessScope,filename);
  return cVar3;
}

Assistant:

cmFileLockResult cmFileLockPool::Release(const std::string& filename)
{
  for (auto& funcScope : this->FunctionScopes) {
    const cmFileLockResult result = funcScope->Release(filename);
    if (!result.IsOk()) {
      return result;
    }
  }

  for (auto& fileScope : this->FileScopes) {
    const cmFileLockResult result = fileScope->Release(filename);
    if (!result.IsOk()) {
      return result;
    }
  }

  return this->ProcessScope.Release(filename);
}